

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

size_t __thiscall GF2::WW<129UL>::Weight(WW<129UL> *this)

{
  byte bVar1;
  WW<129UL> *in_RDI;
  size_t pos;
  size_t weight;
  ulong local_18;
  size_t local_10;
  
  local_10 = 0;
  for (local_18 = 0; local_18 < 0x11; local_18 = local_18 + 1) {
    bVar1 = GetOctet(in_RDI,local_18);
    local_10 = Weight::_bitsperoctet[bVar1] + local_10;
  }
  return local_10;
}

Assistant:

size_t Weight() const
	{	
		static unsigned char _bitsperoctet[256] = 
		{
			0,1,1,2,1,2,2,3,1,2,2,3,2,3,3,4,1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,
			1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
			1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
			2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
			1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
			2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
			2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
			3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,4,5,5,6,5,6,6,7,5,6,6,7,6,7,7,8,
		};
		size_t weight = 0;
		for (size_t pos = 0; pos < _ocount; pos++)
			weight += _bitsperoctet[GetOctet(pos)];
		return weight;
	}